

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmGeneratorTarget *this_00;
  auto_ptr<cmCompiledGeneratorExpression> this_01;
  bool bVar1;
  char *pcVar2;
  cmLocalGenerator *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  mapped_type *pmVar7;
  long lVar8;
  _Alloc_hider _Var9;
  allocator local_271;
  string prepro;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string local_230;
  string exportDirs;
  string dirs;
  cmGeneratorExpression ge;
  string includes;
  
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x16f,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  this_00 = tei->Target;
  std::__cxx11::string::string((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES",(allocator *)&ge)
  ;
  pcVar2 = cmGeneratorTarget::GetProperty(this_00,&includes);
  std::__cxx11::string::~string((string *)&includes);
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&includes);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&includes);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&includes);
  cmGeneratorExpression::Preprocess(&dirs,&tei->InterfaceIncludeDirectories,InstallInterface,true);
  (*this->_vptr_cmExportFileGenerator[0x11])(this,&dirs);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&includes,(string *)&ge);
  cge.x_ = (cmCompiledGeneratorExpression *)includes._M_dataplus;
  includes._M_dataplus._M_p = (pointer)0x0;
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&includes);
  this_01 = cge;
  pcVar3 = cmGeneratorTarget::GetLocalGenerator(this_00);
  std::__cxx11::string::string((string *)&includes,"",(allocator *)&local_230);
  prepro._M_dataplus._M_p = (pointer)&prepro.field_2;
  prepro._M_string_length = 0;
  prepro.field_2._M_local_buf[0] = '\0';
  pcVar4 = cmCompiledGeneratorExpression::Evaluate
                     (this_01.x_,pcVar3,&includes,false,this_00,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&prepro);
  std::__cxx11::string::string((string *)&exportDirs,pcVar4,&local_271);
  std::__cxx11::string::~string((string *)&prepro);
  std::__cxx11::string::~string((string *)&includes);
  if ((cge.x_)->HadContextSensitiveCondition == true) {
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(this_00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includes);
    poVar5 = std::operator<<((ostream *)&includes,"Target \"");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,
                    "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                   );
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&prepro);
    std::__cxx11::string::~string((string *)&prepro);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includes);
    goto LAB_003d683d;
  }
  if (pcVar2 == (char *)0x0) {
    if (exportDirs._M_string_length == 0) goto LAB_003d683d;
LAB_003d665e:
    includes._M_dataplus._M_p = (pointer)0x0;
    includes._M_string_length = 0;
    includes.field_2._M_allocated_capacity = 0;
    cmGeneratorExpression::Split
              (&exportDirs,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&includes);
    std::__cxx11::string::assign((char *)&exportDirs);
    for (_Var9 = includes._M_dataplus; _Var9._M_p != (pointer)includes._M_string_length;
        _Var9._M_p = _Var9._M_p + 0x20) {
      std::__cxx11::string::append((char *)&exportDirs);
      bVar1 = cmsys::SystemTools::FileIsFullPath(*(char **)_Var9._M_p);
      if (!bVar1) {
        lVar8 = std::__cxx11::string::find(_Var9._M_p,0x5736c8);
        if (lVar8 == -1) {
          std::__cxx11::string::append((char *)&exportDirs);
        }
      }
      std::__cxx11::string::append((string *)&exportDirs);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&includes);
    pcVar4 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      pcVar4 = "";
    }
    std::__cxx11::string::string((string *)&includes,pcVar4,(allocator *)&prepro);
    pcVar4 = ";";
    if (pcVar2 == (char *)0x0) {
      pcVar4 = "";
    }
    std::operator+(&prepro,pcVar4,&exportDirs);
    std::__cxx11::string::append((string *)&includes);
    std::__cxx11::string::~string((string *)&prepro);
    cmGeneratorExpression::Preprocess(&prepro,&includes,InstallInterface,true);
    if (prepro._M_string_length != 0) {
      ResolveTargetsInGeneratorExpressions(this,&prepro,this_00,missingTargets,NoReplaceFreeTargets)
      ;
      std::__cxx11::string::string((string *)&local_230,"INTERFACE_INCLUDE_DIRECTORIES",&local_271);
      bVar1 = checkInterfaceDirs(&prepro,this_00,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&local_230,"INTERFACE_INCLUDE_DIRECTORIES",&local_271);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_230);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        std::__cxx11::string::~string((string *)&local_230);
      }
    }
    std::__cxx11::string::~string((string *)&prepro);
  }
  else {
    if ((*pcVar2 != '\0') || (exportDirs._M_string_length != 0)) goto LAB_003d665e;
    std::__cxx11::string::string
              ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES",(allocator *)&prepro);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&includes);
    std::__cxx11::string::assign((char *)pmVar7);
  }
  std::__cxx11::string::~string((string *)&includes);
LAB_003d683d:
  std::__cxx11::string::~string((string *)&exportDirs);
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  std::__cxx11::string::~string((string *)&dirs);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmTargetExport* tei, cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget* target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  const char* input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
    tei->InterfaceIncludeDirectories, preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", false, target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && !*input) && exportDirs.empty()) {
    // Set to empty
    properties[propName] = "";
    return;
  }

  prefixItems(exportDirs);

  std::string includes = (input ? input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target, missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}